

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint16_t *__src;
  uint8_t uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  array_container_t *c;
  int32_t iVar4;
  shared_container_t *sc;
  array_container_t *ac;
  uint16_t *puVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  void **ppvVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ushort uVar24;
  ulong uVar25;
  ulong uVar26;
  ushort uVar27;
  uint uVar28;
  int iVar29;
  bool bVar30;
  uint8_t new_type;
  int32_t union_cardinality;
  uint8_t local_95;
  uint local_94;
  ulong local_90;
  array_container_t *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint local_64;
  uint32_t local_60;
  uint32_t local_5c;
  ulong local_58;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (min <= max) {
    uVar28 = min >> 0x10;
    uVar15 = (ulong)uVar28;
    local_64 = max >> 0x10;
    iVar29 = (r->high_low_container).size;
    if (iVar29 == 0) {
      uVar8 = 0;
      uVar19 = 0;
    }
    else {
      puVar5 = (r->high_low_container).keys;
      uVar19 = 0;
      uVar7 = 0;
      if (0 < iVar29) {
        iVar22 = iVar29 + -1;
        uVar8 = 0;
        do {
          uVar7 = iVar22 + uVar8 >> 1;
          uVar27 = *(ushort *)((long)puVar5 + (ulong)(iVar22 + uVar8 & 0xfffffffe));
          uVar24 = (ushort)(max >> 0x10);
          if (uVar27 < uVar24) {
            uVar8 = uVar7 + 1;
          }
          else {
            if (uVar27 <= uVar24) {
              uVar7 = ~uVar7;
              goto LAB_00111ecb;
            }
            iVar22 = uVar7 - 1;
          }
        } while ((int)uVar8 <= iVar22);
        uVar7 = -uVar8;
        if ((int)uVar8 < 1) {
          uVar7 = uVar8;
        }
      }
LAB_00111ecb:
      uVar8 = uVar7 + iVar29;
      if (uVar7 != 0) {
        uVar19 = 0xffffffff;
        if (0x80000000 < uVar7) {
          uVar7 = ~uVar7;
          uVar18 = 0;
          do {
            uVar19 = uVar7 + uVar18 >> 1;
            uVar27 = *(ushort *)((long)puVar5 + (ulong)(uVar7 + uVar18 & 0xfffffffe));
            uVar24 = (ushort)(min >> 0x10);
            if (uVar27 < uVar24) {
              uVar18 = uVar19 + 1;
            }
            else {
              if (uVar27 <= uVar24) goto LAB_00111f0c;
              uVar7 = uVar19 - 1;
            }
          } while ((int)uVar18 <= (int)uVar7);
          uVar19 = ~uVar18;
        }
LAB_00111f0c:
        uVar19 = (int)uVar19 >> 0x1f ^ uVar19;
      }
    }
    iVar29 = (iVar29 - uVar8) - uVar19;
    local_60 = min;
    local_5c = max;
    if (iVar29 <= (int)(local_64 - uVar28)) {
      ra_shift_tail(&r->high_low_container,uVar8,((local_64 - uVar28) - iVar29) + 1);
    }
    if (local_64 != uVar28 - 1) {
      uVar28 = (uVar19 + iVar29) - 1;
      local_60 = local_60 & 0xffff;
      local_5c = local_5c & 0xffff;
      lVar17 = (long)(int)(~uVar8 + (r->high_low_container).size);
      uVar8 = local_64;
      local_90 = uVar15;
      do {
        uVar19 = 0;
        if ((uint)uVar15 == uVar8) {
          uVar19 = local_60;
        }
        uVar7 = 0xffff;
        if (local_64 == uVar8) {
          uVar7 = local_5c;
        }
        if (((int)uVar28 < 0) ||
           (uVar15 = (ulong)uVar28, uVar8 != (r->high_low_container).keys[uVar15])) {
          if (uVar7 + 1 < uVar19) {
            __assert_fail("range_end >= range_start",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1131,
                          "container_t *container_range_of_ones(uint32_t, uint32_t, uint8_t *)");
          }
          if ((uVar7 - uVar19) + 2 < 3) {
            local_95 = '\x02';
            ac = array_container_create_range(uVar19,uVar7 + 1);
            uVar15 = local_90;
          }
          else {
            local_95 = '\x03';
            ac = (array_container_t *)run_container_create_given_capacity(1);
            uVar15 = local_90;
            if (ac == (array_container_t *)0x0) {
              ac = (array_container_t *)0x0;
            }
            else {
              iVar29 = ac->cardinality;
              *(uint *)(ac->array + (long)iVar29 * 2) = (uVar7 - uVar19) * 0x10000 | uVar19;
              ac->cardinality = iVar29 + 1;
            }
          }
        }
        else {
          uVar18 = uVar28 & 0xffff;
          local_94 = uVar28;
          if ((r->high_low_container).size <= (int)uVar18) {
            __assert_fail("i < ra->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)")
            ;
          }
          ppvVar9 = (r->high_low_container).containers;
          puVar3 = (r->high_low_container).typecodes;
          sc = (shared_container_t *)ppvVar9[uVar18];
          local_80 = uVar15;
          if (puVar3[uVar18] == '\x04') {
            sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar18);
            ppvVar9 = (r->high_low_container).containers;
          }
          uVar15 = local_90;
          ppvVar9[uVar18] = sc;
          ac = (array_container_t *)(r->high_low_container).containers[local_80];
          uVar1 = (r->high_low_container).typecodes[local_80];
          uVar27 = (ushort)uVar7;
          uVar24 = (ushort)uVar19;
          if (uVar1 == '\x03') {
            puVar5 = ac->array;
            iVar29 = ac->cardinality;
            uVar28 = 0;
            iVar22 = 0;
            if (iVar29 != 0) {
              if (iVar29 < 1) {
                iVar22 = 0;
              }
              else {
                iVar14 = iVar29 + -1;
                iVar22 = 0;
                do {
                  uVar18 = (uint)(iVar14 + iVar22) >> 1;
                  if ((ushort)(puVar5[(ulong)uVar18 * 2 + 1] + puVar5[(ulong)uVar18 * 2]) < uVar27)
                  {
                    iVar22 = uVar18 + 1;
                  }
                  else {
                    if ((uint)puVar5[(ulong)uVar18 * 2] <= uVar7 + 1) {
                      iVar22 = ~uVar18 + iVar29;
                      goto LAB_00112480;
                    }
                    iVar14 = uVar18 - 1;
                  }
                } while (iVar22 <= iVar14);
              }
              iVar22 = iVar29 - iVar22;
            }
LAB_00112480:
            iVar14 = iVar29 - iVar22;
            if (iVar14 != 0 && iVar22 <= iVar29) {
              iVar23 = iVar14 + -1;
              uVar18 = 0;
              do {
                uVar28 = iVar23 + uVar18 >> 1;
                if ((ushort)(puVar5[(ulong)uVar28 * 2 + 1] + puVar5[(ulong)uVar28 * 2]) + 1 < uVar19
                   ) {
                  uVar28 = uVar28 + 1;
                }
                else {
                  if (puVar5[(ulong)uVar28 * 2] <= uVar24) break;
                  iVar23 = uVar28 - 1;
                  uVar28 = uVar18;
                }
                uVar18 = uVar28;
              } while ((int)uVar28 <= iVar23);
            }
            uVar18 = uVar28 + iVar22 + 1;
            if ((int)(uVar18 * 4) < 0x2001) {
              local_70 = (ulong)uVar28;
              if (iVar29 == uVar28 + iVar22) {
                local_88 = ac;
                if (ac->capacity <= iVar29) {
                  run_container_grow((run_container_t *)ac,iVar29 + 1,true);
                  iVar29 = local_88->cardinality;
                  puVar5 = local_88->array;
                }
                uVar28 = uVar28 & 0xffff;
                memmove(puVar5 + (ulong)uVar28 * 2 + 2,puVar5 + (ulong)uVar28 * 2,
                        (long)(int)(iVar29 - uVar28) << 2);
                local_88->cardinality = local_88->cardinality + 1;
                puVar5 = local_88->array;
                puVar5[local_70 * 2] = uVar24;
                puVar5[local_70 * 2 + 1] = uVar27 - uVar24;
                ac = local_88;
              }
              else {
                __src = puVar5 + (long)iVar14 * 2;
                if (puVar5[local_70 * 2] < uVar19) {
                  uVar19 = (uint)puVar5[local_70 * 2];
                }
                uVar21 = (uint)__src[-1] + (uint)__src[-2];
                if ((uint)__src[-1] + (uint)__src[-2] <= uVar7) {
                  uVar21 = uVar7;
                }
                puVar5[local_70 * 2] = (uint16_t)uVar19;
                puVar5[local_70 * 2 + 1] = (short)uVar21 - (uint16_t)uVar19;
                local_70 = (ulong)uVar18;
                memmove(puVar5 + (ulong)(uVar28 + 1) * 2,__src,(long)iVar22 << 2);
                ac->cardinality = (int32_t)local_70;
              }
              local_95 = '\x03';
              uVar15 = local_90;
            }
            else {
              ac = (array_container_t *)
                   container_from_run_range((run_container_t *)ac,uVar19,uVar7,&local_95);
              uVar15 = local_90;
            }
          }
          else {
            bVar6 = (byte)uVar19;
            if (uVar1 == '\x02') {
              puVar5 = ac->array;
              uVar28 = ac->cardinality;
              uVar18 = 0;
              if (uVar28 == 0) {
                uVar25 = 0;
              }
              else {
                uVar25 = (ulong)uVar28;
                uVar18 = 0;
                if (0 < (int)uVar28) {
                  iVar29 = uVar28 - 1;
                  iVar22 = 0;
                  do {
                    uVar21 = (uint)(iVar29 + iVar22) >> 1;
                    uVar2 = *(ushort *)((long)puVar5 + (ulong)(iVar29 + iVar22 & 0xfffffffe));
                    if (uVar2 < uVar27) {
                      iVar22 = uVar21 + 1;
                    }
                    else {
                      if (uVar2 <= uVar27) {
                        uVar13 = ~uVar21;
                        uVar25 = (ulong)(uVar28 + uVar13);
                        uVar18 = 0xffffffff;
                        if (uVar21 == 0x7fffffff) goto LAB_0011246d;
                        goto LAB_00112441;
                      }
                      iVar29 = uVar21 - 1;
                    }
                  } while (iVar22 <= iVar29);
                  iVar29 = -iVar22;
                  if (0 < iVar22) {
                    iVar29 = iVar22;
                  }
                  uVar25 = (ulong)(uVar28 - iVar29);
                  if (iVar22 == 0) {
                    uVar18 = 0;
                  }
                  else {
                    uVar13 = -iVar29;
LAB_00112441:
                    uVar13 = ~uVar13;
                    uVar21 = 0;
                    do {
                      uVar18 = uVar13 + uVar21 >> 1;
                      uVar27 = *(ushort *)((long)puVar5 + (ulong)(uVar13 + uVar21 & 0xfffffffe));
                      if (uVar27 < uVar24) {
                        uVar21 = uVar18 + 1;
                      }
                      else {
                        if (uVar27 <= uVar24) goto LAB_0011246d;
                        uVar13 = uVar18 - 1;
                      }
                    } while ((int)uVar21 <= (int)uVar13);
                    uVar18 = ~uVar21;
LAB_0011246d:
                    uVar18 = (int)uVar18 >> 0x1f ^ uVar18;
                  }
                }
              }
              uVar21 = uVar7 - uVar19;
              uVar20 = (ulong)uVar21;
              iVar29 = uVar21 + uVar18 + (int)uVar25 + 1;
              if (iVar29 == 0x10000) {
                local_95 = '\x03';
                ac = (array_container_t *)run_container_create_given_capacity(1);
                if (ac == (array_container_t *)0x0) {
                  ac = (array_container_t *)0x0;
                  uVar15 = local_90;
                  goto LAB_00112790;
                }
                puVar5 = ac->array;
                iVar29 = ac->cardinality;
                (puVar5 + (long)iVar29 * 2)[0] = 0;
                (puVar5 + (long)iVar29 * 2)[1] = 0xffff;
                iVar29 = iVar29 + 1;
              }
              else {
                local_70 = CONCAT44(local_70._4_4_,iVar29);
                local_78 = uVar20;
                if (iVar29 < 0x1001) {
                  local_95 = '\x02';
                  local_88 = ac;
                  if (ac->capacity < iVar29) {
                    local_58 = uVar25;
                    array_container_grow(ac,iVar29,true);
                    uVar21 = (uint)local_78;
                    puVar5 = local_88->array;
                    uVar28 = local_88->cardinality;
                    uVar25 = local_58;
                  }
                  memmove(puVar5 + (int)(uVar21 + uVar18 + 1),puVar5 + (int)(uVar28 - (int)uVar25),
                          (long)(int)uVar25 * 2);
                  puVar5 = local_88->array;
                  lVar12 = (local_78 & 0xffffffff) + 1;
                  do {
                    puVar5[uVar18] = (uint16_t)uVar19;
                    uVar18 = uVar18 + 1;
                    uVar19 = uVar19 + 1;
                    lVar12 = lVar12 + -1;
                  } while (lVar12 != 0);
                  ac = local_88;
                  iVar4 = (int32_t)local_70;
LAB_001126ca:
                  ac->cardinality = iVar4;
                  goto LAB_00112790;
                }
                local_95 = '\x01';
                ac = (array_container_t *)bitset_container_from_array(ac);
                puVar5 = ac->array;
                uVar19 = uVar19 >> 6;
                uVar28 = uVar7 >> 6;
                if (uVar28 - uVar19 == 0) {
                  *(ulong *)(puVar5 + (ulong)uVar19 * 4) =
                       *(ulong *)(puVar5 + (ulong)uVar19 * 4) |
                       (0xffffffffffffffffU >> (0x3fU - (char)local_78 & 0x3f)) << (bVar6 & 0x3f);
                }
                else {
                  uVar25 = (ulong)uVar28;
                  uVar15 = *(ulong *)(puVar5 + uVar25 * 4);
                  *(ulong *)(puVar5 + (ulong)uVar19 * 4) =
                       *(ulong *)(puVar5 + (ulong)uVar19 * 4) | -1L << (bVar6 & 0x3f);
                  if (uVar19 + 1 < uVar28) {
                    local_88 = ac;
                    local_78 = uVar25;
                    memset(puVar5 + (ulong)uVar19 * 4 + 4,0xff,
                           (ulong)((uVar28 - uVar19) - 2 >> 1) * 0x10 + 0x10);
                    uVar25 = local_78;
                    ac = local_88;
                  }
                  *(ulong *)(puVar5 + uVar25 * 4) =
                       uVar15 | 0xffffffffffffffffU >> (~(byte)uVar7 & 0x3f);
                }
                iVar29 = (int32_t)local_70;
              }
              ac->cardinality = iVar29;
              uVar15 = local_90;
            }
            else {
              iVar29 = (uVar7 - uVar19) + ac->cardinality + 1;
              puVar5 = ac->array;
              uVar18 = uVar19 >> 6;
              uVar20 = (ulong)uVar18;
              uVar28 = uVar7 >> 6;
              uVar25 = *(ulong *)(puVar5 + uVar20 * 4);
              if (uVar28 == uVar18) {
                uVar16 = (0xffffffffffffffffU >> (0x3fU - (char)(uVar7 - uVar19) & 0x3f)) <<
                         (bVar6 & 0x3f);
                uVar10 = uVar25 & uVar16;
                uVar10 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
                uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
                iVar29 = iVar29 - (uint)(byte)(((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) *
                                               0x101010101010101 >> 0x38);
                if (iVar29 == 0x10000) {
LAB_00112374:
                  local_95 = '\x03';
                  ac = (array_container_t *)run_container_create_given_capacity(1);
                  uVar15 = local_90;
                  if (ac != (array_container_t *)0x0) {
                    puVar5 = ac->array;
                    iVar29 = ac->cardinality;
                    (puVar5 + (long)iVar29 * 2)[0] = 0;
                    (puVar5 + (long)iVar29 * 2)[1] = 0xffff;
                    iVar4 = iVar29 + 1;
                    goto LAB_001126ca;
                  }
                  ac = (array_container_t *)0x0;
                  goto LAB_00112790;
                }
                local_95 = '\x01';
                *(ulong *)(puVar5 + uVar20 * 4) = uVar25 | uVar16;
              }
              else {
                local_38 = -1L << (bVar6 & 0x3f);
                uVar10 = (uVar25 & local_38) - ((uVar25 & local_38) >> 1 & 0x5555555555555555);
                uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
                uVar10 = ((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
                uVar16 = uVar10 >> 0x38;
                uVar19 = (uint)(byte)(uVar10 >> 0x38);
                local_4c = uVar18 + 1;
                uVar10 = (ulong)uVar28;
                if (local_4c < uVar28) {
                  local_78 = CONCAT44(local_78._4_4_,iVar29);
                  uVar11 = (ulong)local_4c;
                  do {
                    uVar26 = *(ulong *)(puVar5 + uVar11 * 4) -
                             (*(ulong *)(puVar5 + uVar11 * 4) >> 1 & 0x5555555555555555);
                    uVar26 = (uVar26 >> 2 & 0x3333333333333333) + (uVar26 & 0x3333333333333333);
                    uVar19 = (int)uVar16 +
                             (uint)(byte)(((uVar26 >> 4) + uVar26 & 0xf0f0f0f0f0f0f0f) *
                                          0x101010101010101 >> 0x38);
                    uVar16 = (ulong)uVar19;
                    uVar11 = uVar11 + 1;
                  } while (uVar10 != uVar11);
                }
                local_40 = *(ulong *)(puVar5 + uVar10 * 4);
                local_48 = 0xffffffffffffffff >> (~(byte)uVar7 & 0x3f);
                uVar16 = (local_40 & local_48) - ((local_40 & local_48) >> 1 & 0x5555555555555555);
                uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
                iVar29 = iVar29 - ((byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) *
                                          0x101010101010101 >> 0x38) + uVar19);
                local_88 = ac;
                local_70 = uVar20;
                local_58 = uVar25;
                if (iVar29 == 0x10000) goto LAB_00112374;
                local_95 = '\x01';
                *(ulong *)(puVar5 + uVar20 * 4) = uVar25 | local_38;
                if (local_4c < uVar28) {
                  local_78 = CONCAT44(local_78._4_4_,iVar29);
                  memset(puVar5 + uVar20 * 4 + 4,0xff,
                         (ulong)((uVar28 - uVar18) - 2 >> 1) * 0x10 + 0x10);
                  iVar29 = (int32_t)local_78;
                }
                *(ulong *)(puVar5 + uVar10 * 4) = local_40 | local_48;
                ac = local_88;
              }
              ac->cardinality = iVar29;
            }
          }
LAB_00112790:
          uVar28 = local_94;
          c = (array_container_t *)(r->high_low_container).containers[local_80];
          if (ac != c) {
            container_free(c,(r->high_low_container).typecodes[local_80]);
          }
          uVar28 = uVar28 - 1;
        }
        if ((r->high_low_container).size <= lVar17) {
          __assert_fail("i < ra->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1a55,
                        "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                       );
        }
        (r->high_low_container).keys[lVar17] = (uint16_t)uVar8;
        (r->high_low_container).containers[lVar17] = ac;
        (r->high_low_container).typecodes[lVar17] = local_95;
        lVar17 = lVar17 + -1;
        bVar30 = (uint)uVar15 != uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar30);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min, uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length = count_greater(ra->keys, ra->size, max_key);
    int32_t prefix_length = count_less(ra->keys, ra->size - suffix_length,
                                       min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key-1; key--) { // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t* new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, src);
            new_container = container_add_range(ra->containers[src],
                                                ra->typecodes[src],
                                                container_min, container_max,
                                                &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src],
                               ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max+1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, key, new_container,
                                              new_type);
        dst--;
    }
}